

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_a336a3::TransformSelectorFor::TransformSelectorFor
          (TransformSelectorFor *this,index_type start,index_type stop,index_type step)

{
  allocator<char> local_49;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"FOR",&local_49);
  TransformSelector::TransformSelector((TransformSelector *)this,&local_48);
  (this->super_TransformSelectorIndexes).super_TransformSelector.super_TransformSelector.
  _vptr_TransformSelector = (_func_int **)&PTR__TransformSelectorIndexes_00a9f2b0;
  (this->super_TransformSelectorIndexes).Indexes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformSelectorIndexes).Indexes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformSelectorIndexes).Indexes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_TransformSelectorIndexes).super_TransformSelector.super_TransformSelector.
  _vptr_TransformSelector = (_func_int **)&PTR__TransformSelectorIndexes_00a9f2f0;
  this->Start = start;
  this->Stop = stop;
  this->Step = step;
  return;
}

Assistant:

TransformSelectorFor(index_type start, index_type stop, index_type step)
    : TransformSelectorIndexes("FOR")
    , Start(start)
    , Stop(stop)
    , Step(step)
  {
  }